

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int mbedtls_gcm_auth_decrypt
              (mbedtls_gcm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *tag,size_t tag_len,uchar *input,uchar *output)

{
  int iVar1;
  size_t sVar2;
  byte bVar3;
  uchar check_tag [16];
  
  bVar3 = 0;
  iVar1 = mbedtls_gcm_crypt_and_tag
                    (ctx,0,length,iv,iv_len,add,add_len,input,output,tag_len,check_tag);
  if (iVar1 == 0) {
    for (sVar2 = 0; tag_len != sVar2; sVar2 = sVar2 + 1) {
      bVar3 = bVar3 | check_tag[sVar2] ^ tag[sVar2];
    }
    if (bVar3 == 0) {
      iVar1 = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      iVar1 = -0x12;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_auth_decrypt( mbedtls_gcm_context *ctx,
                      size_t length,
                      const unsigned char *iv,
                      size_t iv_len,
                      const unsigned char *add,
                      size_t add_len,
                      const unsigned char *tag,
                      size_t tag_len,
                      const unsigned char *input,
                      unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];
    size_t i;
    int diff;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( iv != NULL );
    GCM_VALIDATE_RET( add_len == 0 || add != NULL );
    GCM_VALIDATE_RET( tag != NULL );
    GCM_VALIDATE_RET( length == 0 || input != NULL );
    GCM_VALIDATE_RET( length == 0 || output != NULL );

    if( ( ret = mbedtls_gcm_crypt_and_tag( ctx, MBEDTLS_GCM_DECRYPT, length,
                                   iv, iv_len, add, add_len,
                                   input, output, tag_len, check_tag ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < tag_len; i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_platform_zeroize( output, length );
        return( MBEDTLS_ERR_GCM_AUTH_FAILED );
    }

    return( 0 );
}